

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

TRef rec_cat(jit_State *J,BCReg baseslot,BCReg topslot)

{
  uint *puVar1;
  TRef *pTVar2;
  TValue TVar3;
  TRef *pTVar4;
  TValue TVar5;
  TValue TVar6;
  TValue TVar7;
  TValue TVar8;
  TRef TVar9;
  TRef TVar10;
  TValue *pTVar11;
  uint *puVar12;
  uint *puVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  BCReg BVar17;
  TValue savetv [5];
  RecordIndex ix;
  
  pTVar2 = J->base;
  for (BVar17 = baseslot; BVar17 <= topslot; BVar17 = BVar17 + 1) {
    if (J->base[BVar17] == 0) {
      sload(J,BVar17);
    }
  }
  puVar1 = pTVar2 + topslot;
  if ((((*puVar1 & 0x1f000000) == 0x4000000) || ((*puVar1 >> 0x18 & 0x1e) - 0xe < 6)) &&
     (((puVar1[-1] & 0x1f000000) == 0x4000000 || ((puVar1[-1] >> 0x18 & 0x1e) - 0xe < 6)))) {
    pTVar4 = J->base;
    lVar16 = -4 - (long)(pTVar2 + topslot);
    for (puVar12 = puVar1; pTVar4 + baseslot <= puVar12; puVar12 = puVar12 + -1) {
      uVar14 = *puVar12;
      if ((uVar14 >> 0x18 & 0x1e) - 0xe < 6) {
        (J->fold).ins.field_0.ot = 0x5d04;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar14;
        *(ushort *)((long)&(J->fold).ins + 2) = (ushort)((uVar14 & 0x1f000000) == 0xe000000);
        TVar9 = lj_opt_fold(J);
        *puVar12 = TVar9;
      }
      else if ((uVar14 & 0x1f000000) != 0x4000000) break;
      lVar16 = lVar16 + 4;
    }
    puVar12 = puVar12 + 1;
    TVar9 = lj_ir_kptr_(J,IR_KPTR,J[-1].penalty + 0x31);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x55090000;
    TVar10 = lj_opt_fold(J);
    puVar13 = puVar12;
    TVar9 = TVar10;
    do {
      uVar14 = *puVar13;
      puVar13 = puVar13 + 1;
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
      (J->fold).ins.field_0.op2 = (IRRef1)uVar14;
      TVar9 = lj_opt_fold(J);
    } while (puVar13 <= puVar1);
    (J->fold).ins.field_0.ot = 0x5784;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
    ix.key = lj_opt_fold(J);
    BVar17 = (BCReg)((ulong)-(lVar16 + (long)J->base) >> 2);
    J->maxslot = BVar17;
    if (puVar12 == pTVar4 + baseslot) {
      return ix.key;
    }
    uVar14 = BVar17 - 1;
    J->maxslot = uVar14;
    *puVar12 = ix.key;
    ix.keyv.u64 = (ulong)(J[-1].penalty + 0x2c) | 0xfffd800000000000;
    pTVar11 = J->L->base;
  }
  else {
    uVar14 = topslot - 1;
    J->maxslot = uVar14;
    pTVar11 = J->L->base;
    ix.keyv = pTVar11[topslot];
    ix.key = *puVar1;
    puVar12 = puVar1;
  }
  uVar15 = (ulong)uVar14;
  ix.tabv = pTVar11[uVar15];
  ix.tab = puVar12[-1];
  TVar5 = pTVar11[uVar15];
  TVar6 = (pTVar11 + uVar15)[1];
  TVar7 = pTVar11[uVar15 + 2];
  TVar8 = (pTVar11 + uVar15 + 2)[1];
  TVar3 = pTVar11[uVar15 + 4];
  rec_mm_arith(J,&ix,MM_concat);
  pTVar11 = J->L->base;
  pTVar11[uVar15 + 4] = TVar3;
  pTVar11[uVar15 + 2] = TVar7;
  (pTVar11 + uVar15 + 2)[1] = TVar8;
  pTVar11[uVar15] = TVar5;
  (pTVar11 + uVar15)[1] = TVar6;
  return 0;
}

Assistant:

static TRef rec_cat(jit_State *J, BCReg baseslot, BCReg topslot)
{
  TRef *top = &J->base[topslot];
  TValue savetv[5];
  BCReg s;
  RecordIndex ix;
  lj_assertJ(baseslot < topslot, "bad CAT arg");
  for (s = baseslot; s <= topslot; s++)
    (void)getslot(J, s);  /* Ensure all arguments have a reference. */
  if (tref_isnumber_str(top[0]) && tref_isnumber_str(top[-1])) {
    TRef tr, hdr, *trp, *xbase, *base = &J->base[baseslot];
    /* First convert numbers to strings. */
    for (trp = top; trp >= base; trp--) {
      if (tref_isnumber(*trp))
	*trp = emitir(IRT(IR_TOSTR, IRT_STR), *trp,
		      tref_isnum(*trp) ? IRTOSTR_NUM : IRTOSTR_INT);
      else if (!tref_isstr(*trp))
	break;
    }
    xbase = ++trp;
    tr = hdr = emitir(IRT(IR_BUFHDR, IRT_PGC),
		      lj_ir_kptr(J, &J2G(J)->tmpbuf), IRBUFHDR_RESET);
    do {
      tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr, *trp++);
    } while (trp <= top);
    tr = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
    J->maxslot = (BCReg)(xbase - J->base);
    if (xbase == base) return tr;  /* Return simple concatenation result. */
    /* Pass partial result. */
    topslot = J->maxslot--;
    *xbase = tr;
    top = xbase;
    setstrV(J->L, &ix.keyv, &J2G(J)->strempty);  /* Simulate string result. */
  } else {
    J->maxslot = topslot-1;
    copyTV(J->L, &ix.keyv, &J->L->base[topslot]);
  }
  copyTV(J->L, &ix.tabv, &J->L->base[topslot-1]);
  ix.tab = top[-1];
  ix.key = top[0];
  memcpy(savetv, &J->L->base[topslot-1], sizeof(savetv));  /* Save slots. */
  rec_mm_arith(J, &ix, MM_concat);  /* Call __concat metamethod. */
  memcpy(&J->L->base[topslot-1], savetv, sizeof(savetv));  /* Restore slots. */
  return 0;  /* No result yet. */
}